

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::Meta::Decoration,_0UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,
          SmallVector<spirv_cross::Meta::Decoration,_0UL> *other)

{
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::Meta::Decoration,_0UL> *other_local;
  SmallVector<spirv_cross::Meta::Decoration,_0UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
    for (local_28 = 0;
        local_28 < (other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
        local_28 = local_28 + 1) {
      Meta::Decoration::Decoration
                ((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr + local_28,
                 (other->super_VectorView<spirv_cross::Meta::Decoration>).ptr + local_28);
    }
    (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size =
         (other->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}